

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

void qStreamNtlmString(QDataStream *ds,QString *s,bool unicode)

{
  char16_t *pcVar1;
  long lVar2;
  undefined3 in_register_00000011;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000011,unicode) == 0) {
    QString::toLatin1_helper((QString *)&local_40);
    qStreamNtlmBuffer(ds,(QByteArray *)&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  }
  else {
    pcVar1 = (s->d).ptr;
    lVar2 = (s->d).size;
    for (lVar3 = 0; lVar2 * 2 != lVar3; lVar3 = lVar3 + 2) {
      QDataStream::operator<<(ds,*(short *)((long)pcVar1 + lVar3));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qStreamNtlmString(QDataStream& ds, const QString& s, bool unicode)
{
    if (!unicode) {
        qStreamNtlmBuffer(ds, s.toLatin1());
        return;
    }

    for (QChar ch : s)
        ds << quint16(ch.unicode());
}